

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

Filter * __thiscall
helics::ConnectorFederateManager::registerFilter
          (ConnectorFederateManager *this,string_view name,string_view type_in,string_view type_out)

{
  _Head_base<0UL,_helics::Filter_*,_false> _Var1;
  int iVar2;
  undefined4 extraout_var;
  RegistrationFailure *this_00;
  char *pcVar3;
  size_t sVar4;
  string_view searchValue;
  string_view message;
  _Head_base<0UL,_helics::Filter_*,_false> local_50;
  InterfaceHandle handle;
  string_view name_local;
  handle filts;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  handle.hid = (*this->coreObject->_vptr_Core[0x3b])();
  if (handle.hid == -1700000000) {
    this_00 = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    message._M_str = "Unable to register Filter";
    message._M_len = 0x19;
    RegistrationFailure::RegistrationFailure(this_00,message);
    __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  std::
  make_unique<helics::Filter,helics::Federate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
            ((Federate **)&local_50,(basic_string_view<char,_std::char_traits<char>_> *)&this->fed,
             (InterfaceHandle *)&name_local);
  _Var1._M_head_impl = local_50._M_head_impl;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(&filts,&this->filters);
  pcVar3 = name_local._M_str;
  sVar4 = name_local._M_len;
  if (name_local._M_len == 0) {
    iVar2 = (*this->coreObject->_vptr_Core[0x28])
                      (this->coreObject,
                       (ulong)(uint)((local_50._M_head_impl)->super_Interface).handle.hid);
    pcVar3 = *(char **)CONCAT44(extraout_var,iVar2);
    sVar4 = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  }
  searchValue._M_str = pcVar3;
  searchValue._M_len = sVar4;
  gmlc::containers::
  StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
  ::insert<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
            ((StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
              *)filts.data,searchValue,
             (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)&local_50);
  std::unique_lock<std::shared_mutex>::~unique_lock(&filts.m_handle_lock);
  if (local_50._M_head_impl != (Filter *)0x0) {
    (*((local_50._M_head_impl)->super_Interface)._vptr_Interface[1])();
  }
  return _Var1._M_head_impl;
}

Assistant:

Filter& ConnectorFederateManager::registerFilter(std::string_view name,
                                                 std::string_view type_in,
                                                 std::string_view type_out)
{
    auto handle = coreObject->registerFilter(name, type_in, type_out);
    if (handle.isValid()) {
        auto filtPtr = std::make_unique<Filter>(fed, name, handle);
        Filter& filt = *filtPtr;
        auto filts = filters.lock();
        if (name.empty()) {
            filts->insert(coreObject->getHandleName(filtPtr->getHandle()), std::move(filtPtr));
        } else {
            filts->insert(name, std::move(filtPtr));
        }
        return filt;
    }
    throw(RegistrationFailure("Unable to register Filter"));
}